

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::ObjectField::ObjectField
          (ObjectField *this,Kind kind,Fodder *fodder1,Fodder *fodder2,Fodder *fodder_l,
          Fodder *fodder_r,Hide hide,bool super_sugar,bool method_sugar,AST *expr1,Identifier *id,
          LocationRange *id_lr,ArgParams *params,bool trailing_comma,Fodder *op_fodder,AST *expr2,
          AST *expr3,Fodder *comma_fodder)

{
  size_type sVar1;
  int in_ESI;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_RDI;
  bool bVar2;
  int in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  pointer in_stack_00000020;
  pointer in_stack_00000028;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_00000038;
  byte in_stack_00000040;
  pointer in_stack_00000050;
  pointer in_stack_00000058;
  LocationRange *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  byte local_a8;
  bool local_a6;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  pointer *__x;
  
  *(int *)&(in_RDI->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_start = in_ESI;
  __x = &(in_RDI->
         super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  *(int *)&in_RDI[4].
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           ._M_impl.super__Vector_impl_data._M_finish = in_stack_00000008;
  *(byte *)((long)&in_RDI[4].
                   super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4) = in_stack_00000010 & 1;
  *(byte *)((long)&in_RDI[4].
                   super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 5) = in_stack_00000018 & 1;
  in_RDI[4].
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_00000020;
  in_RDI[5].
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_start = in_stack_00000028;
  LocationRange::LocationRange
            ((LocationRange *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (in_RDI,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                     *)__x);
  *(byte *)&in_RDI[9].
            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ._M_impl.super__Vector_impl_data._M_start = in_stack_00000040 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  in_RDI[10].
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = in_stack_00000050;
  in_RDI[10].
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_00000058;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_RDI,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  local_a1 = 1;
  if (in_ESI == 0) {
    local_a2 = 0;
    if ((in_stack_00000008 == 2) &&
       (local_a2 = 0,
       ((ulong)in_RDI[4].
               super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) == 0)) {
      local_a2 = *(byte *)((long)&in_RDI[4].
                                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 5) ^ 0xff;
    }
    local_a1 = local_a2;
  }
  if ((local_a1 & 1) == 0) {
    __assert_fail("kind != ASSERT || (hide == VISIBLE && !superSugar && !methodSugar)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2ad,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  local_a3 = 1;
  if (in_ESI == 4) {
    local_a4 = 0;
    if (in_stack_00000008 == 2) {
      local_a4 = *(byte *)((long)&in_RDI[4].
                                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4) ^ 0xff;
    }
    local_a3 = local_a4;
  }
  if ((local_a3 & 1) == 0) {
    __assert_fail("kind != LOCAL || (hide == VISIBLE && !superSugar)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2ae,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  local_a6 = true;
  if (in_ESI == 1) {
    local_a6 = in_stack_00000028 != (pointer)0x0 && in_stack_00000020 == (pointer)0x0;
  }
  if (!local_a6) {
    __assert_fail("kind != FIELD_ID || (id != nullptr && expr1 == nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2af,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  bVar2 = true;
  if ((in_ESI != 1) && (bVar2 = true, in_ESI != 4)) {
    bVar2 = in_stack_00000028 == (pointer)0x0;
  }
  if (bVar2) {
    local_a8 = 1;
    if (((ulong)in_RDI[4].
                super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0x10000000000) == 0) {
      sVar1 = std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
              ::size(in_stack_00000038);
      local_a8 = 0;
      if (sVar1 == 0) {
        local_a8 = *(byte *)&in_RDI[9].
                             super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                             ._M_impl.super__Vector_impl_data._M_start ^ 0xff;
      }
    }
    if ((local_a8 & 1) == 0) {
      __assert_fail("methodSugar || (params.size() == 0 && !trailingComma)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                    0x2b1,
                    "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                   );
    }
    if (in_ESI != 0 && in_stack_00000058 != (pointer)0x0) {
      __assert_fail("kind == ASSERT || expr3 == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                    0x2b2,
                    "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                   );
    }
    return;
  }
  __assert_fail("kind == FIELD_ID || kind == LOCAL || id == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                0x2b0,
                "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
               );
}

Assistant:

ObjectField(enum Kind kind, const Fodder &fodder1, const Fodder &fodder2,
                const Fodder &fodder_l, const Fodder &fodder_r, enum Hide hide, bool super_sugar,
                bool method_sugar, AST *expr1, const Identifier *id, const LocationRange &id_lr,
                const ArgParams &params, bool trailing_comma, const Fodder &op_fodder, AST *expr2,
                AST *expr3, const Fodder &comma_fodder)
        : kind(kind),
          fodder1(fodder1),
          fodder2(fodder2),
          fodderL(fodder_l),
          fodderR(fodder_r),
          hide(hide),
          superSugar(super_sugar),
          methodSugar(method_sugar),
          expr1(expr1),
          id(id),
          idLocation(id_lr),
          params(params),
          trailingComma(trailing_comma),
          opFodder(op_fodder),
          expr2(expr2),
          expr3(expr3),
          commaFodder(comma_fodder)
    {
        // Enforce what is written in comments above.
        assert(kind != ASSERT || (hide == VISIBLE && !superSugar && !methodSugar));
        assert(kind != LOCAL || (hide == VISIBLE && !superSugar));
        assert(kind != FIELD_ID || (id != nullptr && expr1 == nullptr));
        assert(kind == FIELD_ID || kind == LOCAL || id == nullptr);
        assert(methodSugar || (params.size() == 0 && !trailingComma));
        assert(kind == ASSERT || expr3 == nullptr);
    }